

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::copyArraySizes(TType *this,TArraySizes *s)

{
  TArraySizes *this_00;
  
  this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
  (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
  (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
  this_00->implicitArraySize = 0;
  this_00->implicitlySized = true;
  this_00->variablyIndexed = false;
  this->arraySizes = this_00;
  TArraySizes::operator=(this_00,s);
  return;
}

Assistant:

void copyArraySizes(const TArraySizes& s)
    {
        // For setting a fresh new set of array sizes, not yet worrying about sharing.
        arraySizes = new TArraySizes;
        *arraySizes = s;
    }